

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if2.c
# Opt level: O0

void findNotifyBits(int pi)

{
  int in_EDI;
  int unaff_retaddr;
  uint32_t bits;
  callback_t *p;
  uint local_14;
  callback_t *pcVar1;
  int in_stack_fffffffffffffff8;
  
  local_14 = 0;
  for (pcVar1 = gCallBackFirst; pcVar1 != (callback_t *)0x0; pcVar1 = pcVar1->next) {
    if (pcVar1->pi == in_EDI) {
      local_14 = 1 << ((byte)pcVar1->gpio & 0x1f) | local_14;
    }
  }
  if (local_14 != gNotifyBits[in_EDI]) {
    gNotifyBits[in_EDI] = local_14;
    pigpio_command(unaff_retaddr,in_EDI,in_stack_fffffffffffffff8,0,0);
  }
  return;
}

Assistant:

static void findNotifyBits(int pi)
{
   callback_t *p;
   uint32_t bits = 0;

   p = gCallBackFirst;

   while (p)
   {
      if (p->pi == pi) bits |= (1<<(p->gpio));
      p = p->next;
   }

   if (bits != gNotifyBits[pi])
   {
      gNotifyBits[pi] = bits;
      pigpio_command(pi, PI_CMD_NB, gPigHandle[pi], gNotifyBits[pi], 1);
   }
}